

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O0

JPolComponent_VectorImplementation * __thiscall
JPolComponent_VectorImplementation::operator=
          (JPolComponent_VectorImplementation *this,JPolComponent_VectorImplementation *o)

{
  value_type pPVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference ppPVar4;
  reference ppPVar5;
  value_type pPVar6;
  JPolComponent_VectorImplementation *in_RSI;
  JPolComponent_VectorImplementation *in_RDI;
  PolicyPureVector *copy;
  PolicyPureVector *this_pol;
  PolicyPureVector *o_pol;
  Index i;
  size_t s;
  PolicyPureVector *in_stack_ffffffffffffffa8;
  PolicyPureVector *in_stack_ffffffffffffffb0;
  uint local_2c;
  JPolComponent_VectorImplementation *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    sVar2 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::size
                      (&in_RDI->_m_indivPols_PolicyPureVector);
    sVar3 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::size
                      (&in_RSI->_m_indivPols_PolicyPureVector);
    if (sVar2 != sVar3) {
      ClearIndividualPolicies(in_RDI);
      std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::size
                (&in_RSI->_m_indivPols_PolicyPureVector);
      std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::resize
                ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                 in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,(value_type *)in_RDI
                );
    }
    for (local_2c = 0;
        sVar2 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::size
                          (&in_RDI->_m_indivPols_PolicyPureVector), local_8 = in_RDI,
        local_2c < sVar2; local_2c = local_2c + 1) {
      ppPVar4 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                          (&in_RSI->_m_indivPols_PolicyPureVector,(ulong)local_2c);
      pPVar6 = *ppPVar4;
      ppPVar5 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                          (&in_RDI->_m_indivPols_PolicyPureVector,(ulong)local_2c);
      pPVar1 = *ppPVar5;
      if (pPVar1 == (value_type)0x0) {
        pPVar6 = (value_type)operator_new(0x50);
        PolicyPureVector::PolicyPureVector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        ppPVar5 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                            (&in_RDI->_m_indivPols_PolicyPureVector,(ulong)local_2c);
        *ppPVar5 = pPVar6;
      }
      else {
        (*(pPVar1->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy._vptr_Policy[9])
                  (pPVar1,pPVar6);
      }
    }
  }
  return local_8;
}

Assistant:

JPolComponent_VectorImplementation& JPolComponent_VectorImplementation::operator= (const JPolComponent_VectorImplementation& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...

    //we delete the PolicyPureVectors pointed to: 
    //this means that we should not be able 
    //to add indiv. policies without copying them!!! 
    size_t s = _m_indivPols_PolicyPureVector.size() ;
    if( s != o._m_indivPols_PolicyPureVector.size() )
    {
        ClearIndividualPolicies();
        _m_indivPols_PolicyPureVector.resize( 
                o._m_indivPols_PolicyPureVector.size(), 0);
    }
    
    for(Index i=0; i < _m_indivPols_PolicyPureVector.size() ; i++)
    {
        PolicyPureVector* o_pol = o._m_indivPols_PolicyPureVector[i];
        PolicyPureVector* this_pol =   this->_m_indivPols_PolicyPureVector[i];     
        if(this_pol == 0) // this->_m_indivPols_PolicyPureVector[i] == 0
        {
            //this pol is not a jppv yet, so we need to copy
            PolicyPureVector* copy =  new PolicyPureVector(*o_pol);
            this->_m_indivPols_PolicyPureVector[i] = copy;
        }
        else
        {
            //this_pol is an existing ppv: do assignment.
            (*this_pol) = (*o_pol);
        }
    }
    return *this;
}